

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxlib.c
# Opt level: O3

size_t split_fields(char *text,char *sep,char ***fields)

{
  size_t sVar1;
  char *__dest;
  char *__s;
  void *__ptr;
  size_t sVar2;
  char *__dest_00;
  char **ppcVar3;
  size_t sVar4;
  
  sVar1 = strlen(text);
  __dest = (char *)calloc(sVar1 + 1,1);
  strcpy(__dest,text);
  __s = strtok(__dest,sep);
  if (__s == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    __ptr = calloc(0x400,8);
    sVar1 = 0;
    sVar4 = 0;
    do {
      sVar2 = strlen(__s);
      __dest_00 = (char *)calloc(sVar2 + 1,8);
      *(char **)((long)__ptr + sVar1) = __dest_00;
      strcpy(__dest_00,__s);
      sVar4 = sVar4 + 1;
      __s = strtok((char *)0x0,sep);
      sVar1 = sVar1 + 8;
    } while (__s != (char *)0x0);
    free(__dest);
    ppcVar3 = (char **)realloc(__ptr,sVar1);
    *fields = ppcVar3;
  }
  return sVar4;
}

Assistant:

size_t 
split_fields(const char* text, const char* sep, char*** fields) 
{
	char*  buf    = (char*)NULL;
	char*  token  = (char*)NULL;
	char**  work  = (char**)NULL;
	size_t result = 0;
	size_t n_field = 0;
	
	buf = (char*)calloc(strlen(text) + 1, sizeof(char));
	strcpy(buf, text);
	
	token = strtok(buf, sep);
    /* TODO if separator not found, leave */
    if (!token) {
		/* TODO report reading problem */
        return 0;
	}
	// printf("1st token '%s'\n", token);
	
	work = (char**)calloc(1024, sizeof(char*));

    /* TODO get all elements */
	while (token) {
		work[n_field] = 
			(char*)calloc(strlen(token) + 1, sizeof(char*));
		strcpy(work[n_field], token);
		
		n_field++;
		token = strtok(NULL, sep);
		// printf("token %ld '%s'\n", n_field, token);
	}

	result = n_field;
	
	free(buf);
	work = (char**)realloc(work, result * sizeof(char*));
	
	*fields = work;
	
	/* Normal function termination */
	return result;
}